

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::GraphicBasicTestInstance::iterate
          (TestStatus *__return_storage_ptr__,GraphicBasicTestInstance *this)

{
  GraphicBasicTestInstance *this_local;
  
  (*(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance[3])();
  creatColorAttachmentAndRenderPass(this);
  (*(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance[4])();
  (*(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance[5])
            (__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus GraphicBasicTestInstance::iterate (void)
{
	checkExtensions();
	creatColorAttachmentAndRenderPass();
	createPipeline();
	return executeTest();
}